

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Tokens * __thiscall lexer::Lexer::analize(Tokens *__return_storage_ptr__,Lexer *this,string *string)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  reference this_00;
  reference pvVar5;
  LexerError *this_01;
  int iVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  uint local_b8;
  uint local_b4;
  string token;
  undefined1 local_68 [40];
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  (__return_storage_ptr__->super__Vector_base<lexer::Token,_std::allocator<lexer::Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<lexer::Token,_std::allocator<lexer::Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<lexer::Token,_std::allocator<lexer::Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  pcVar4 = (string->_M_dataplus)._M_p;
  uVar10 = 1;
  local_b8 = 0;
  uVar8 = 0;
  local_b4 = 1;
  iVar6 = 0;
  pcVar9 = pcVar4;
  do {
    if (pcVar9 == pcVar4 + string->_M_string_length) {
      std::__cxx11::string::~string((string *)&token);
      return __return_storage_ptr__;
    }
    uVar8 = uVar8 + 1;
    cVar1 = *pcVar9;
    if (cVar1 == '\n') {
      uVar8 = 0;
    }
    this_00 = std::
              vector<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
              ::at(&this->lexerStateMachine,(long)iVar6);
    pvVar5 = std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>::at
                       (this_00,(long)*pcVar9);
    iVar6 = pvVar5->ruleId;
    iVar2 = pvVar5->tokenId;
    iVar3 = pvVar5->increment;
    if ((pvVar5->putChar & 1U) != 0) {
      std::__cxx11::string::push_back((char)&token);
    }
    uVar7 = (int)uVar10 + (uint)(cVar1 == '\n');
    uVar10 = (ulong)uVar7;
    if (iVar6 == 0) {
      if (iVar2 != -2) {
        local_68._0_4_ = iVar2;
        std::__cxx11::string::string((string *)(local_68 + 8),(string *)&token);
        local_40 = local_b4;
        local_38 = local_b8;
        local_3c = uVar7;
        local_34 = uVar8;
        std::vector<lexer::Token,_std::allocator<lexer::Token>_>::emplace_back<lexer::Token>
                  (__return_storage_ptr__,(Token *)local_68);
        std::__cxx11::string::~string((string *)(local_68 + 8));
      }
      token._M_string_length = 0;
      *token._M_dataplus._M_p = '\0';
      local_b8 = uVar8;
      local_b4 = uVar7;
    }
    else if (iVar6 == -1) {
      this_01 = (LexerError *)__cxa_allocate_exception(0x10);
      common::xsnprintf_abi_cxx11_
                ((string *)local_68,0x40,"invalid char \"%c\" at %d:%d",(ulong)(uint)(int)*pcVar9,
                 uVar10,(ulong)uVar8);
      LexerError::LexerError(this_01,(string *)local_68);
      __cxa_throw(this_01,&LexerError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar9 = pcVar9 + iVar3;
    pcVar4 = (string->_M_dataplus)._M_p;
  } while( true );
}

Assistant:

Tokens analize(std::string const& string) {
            RuleId currentState = Initial;
            Tokens tokens;
            std::string token;
            int line = 1;
            int column = 0;
            int prevLine = line;
            int prevColumn = column;
            for (std::string::const_iterator c = string.begin(); c != string.end();) {
                if (*c == '\n') {
                    ++line;
                    column = 0;
                } else {
                    ++column;
                }
                Transition transition = lexerStateMachine.
                        at(static_cast<size_t>(currentState)).
                        at(static_cast<size_t>(*c));

                if (transition.putChar)
                    token.push_back(*c);

                if (transition.ruleId == InvalidRule)
                    throw LexerError(common::xsnprintf(64, "invalid char \"%c\" at %d:%d", *c, line, column));
                else {
                    if (transition.ruleId == Initial) {
                        if (transition.tokenId != Skip)
                            tokens.push_back(Token(static_cast<TokenId>(transition.tokenId), token, prevLine, line, prevColumn, column));
                        prevLine = line;
                        prevColumn = column;
                        token.clear();
                    }
                    currentState = transition.ruleId;
                }
                c += transition.increment;
            }
            return tokens;
        }